

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGaussianCurvatures
          (IntrinsicGeometryInterface *this)

{
  SurfaceMesh *pSVar1;
  size_t sVar2;
  pointer puVar3;
  pointer puVar4;
  double *pdVar5;
  double *pdVar6;
  unsigned_long uVar7;
  long lVar8;
  runtime_error *this_00;
  long *plVar9;
  size_t sVar10;
  size_t sVar11;
  size_type *psVar12;
  long *plVar13;
  ParentMeshT *pPVar14;
  unsigned_long uVar15;
  int iVar16;
  double dVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 local_e8 [24];
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->cornerScaledAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->cornerScaledAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->cornerScaledAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)local_e8,
             (this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Face,_double>::operator=
            (&this->faceGaussianCurvatures,
             (MeshData<geometrycentral::surface::Face,_double> *)local_e8);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)local_e8);
  pSVar1 = (this->super_BaseGeometryInterface).mesh;
  sVar2 = pSVar1->nFacesFillCount;
  if ((sVar2 == 0) ||
     (puVar3 = (pSVar1->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff)) {
    sVar10 = 0;
  }
  else {
    sVar11 = 0;
    do {
      sVar10 = sVar2;
      if (sVar2 - 1 == sVar11) break;
      sVar10 = sVar11 + 1;
      lVar8 = sVar11 + 1;
      sVar11 = sVar10;
    } while (puVar3[lVar8] == 0xffffffffffffffff);
  }
  if (sVar10 != sVar2) {
    puVar3 = (pSVar1->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pSVar1->fHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->cornerScaledAngles).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pdVar6 = (this->faceGaussianCurvatures).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    do {
      uVar7 = puVar4[sVar10];
      iVar16 = 3;
      dVar17 = -3.141592653589793;
      uVar15 = uVar7;
      do {
        dVar17 = dVar17 + pdVar5[uVar15];
        uVar15 = puVar3[uVar15];
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      if (uVar15 != uVar7) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
                   ,"");
        ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_b0);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_70);
        local_128._M_dataplus._M_p = (pointer)*plVar9;
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)local_128._M_dataplus._M_p == psVar12) {
          local_128.field_2._M_allocated_capacity = *psVar12;
          local_128.field_2._8_8_ = plVar9[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar12;
        }
        local_128._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::to_string(&local_90,0xc6);
        ::std::operator+(&local_50,&local_128,&local_90);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_50);
        local_108 = (long *)*plVar9;
        plVar13 = plVar9 + 2;
        if (local_108 == plVar13) {
          local_f8 = *plVar13;
          lStack_f0 = plVar9[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar13;
        }
        local_100 = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_108);
        local_e8._0_8_ = *plVar9;
        pPVar14 = (ParentMeshT *)(plVar9 + 2);
        if ((ParentMeshT *)local_e8._0_8_ == pPVar14) {
          local_e8._16_8_ = pPVar14->_vptr_SurfaceMesh;
          lStack_d0 = plVar9[3];
          local_e8._0_8_ = (ParentMeshT *)(local_e8 + 0x10);
        }
        else {
          local_e8._16_8_ = pPVar14->_vptr_SurfaceMesh;
        }
        local_e8._8_8_ = plVar9[1];
        *plVar9 = (long)pPVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::runtime_error::runtime_error(this_00,(string *)local_e8);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      pdVar6[sVar10] = dVar17;
      sVar11 = sVar10;
      do {
        sVar10 = sVar2;
        if (sVar2 - 1 == sVar11) break;
        sVar10 = sVar11 + 1;
        lVar8 = sVar11 + 1;
        sVar11 = sVar10;
      } while (puVar4[lVar8] == 0xffffffffffffffff);
    } while (sVar10 != sVar2);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGaussianCurvatures() {
  cornerScaledAnglesQ.ensureHave();

  faceGaussianCurvatures = FaceData<double>(mesh);

  for (Face f : mesh.faces()) {

    double angleDefect = -PI;
    Halfedge he = f.halfedge();
    for (int i = 0; i < 3; i++) {
      angleDefect += cornerScaledAngles[he.corner()];
      he = he.next();
    }
    GC_SAFETY_ASSERT(he == f.halfedge(), "faces mush be triangular");

    faceGaussianCurvatures[f] = angleDefect;
  }
}